

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::AdapterPromiseNode<kj::_::Void,_kj::Canceler::AdapterImpl<void>_>::fulfill
          (AdapterPromiseNode<kj::_::Void,_kj::Canceler::AdapterImpl<void>_> *this,Void *value)

{
  ExceptionOrValue local_180;
  char local_20;
  
  if (this->waiting == true) {
    this->waiting = false;
    local_180.exception.ptr.isSet = false;
    local_20 = '\x01';
    ExceptionOrValue::operator=(&(this->result).super_ExceptionOrValue,&local_180);
    if ((ExceptionOr<kj::_::Void> *)&local_180 != &this->result) {
      if ((this->result).value.ptr.isSet == true) {
        (this->result).value.ptr.isSet = false;
      }
      if (local_20 == '\x01') {
        (this->result).value.ptr.isSet = true;
      }
    }
    if (local_180.exception.ptr.isSet == true) {
      Exception::~Exception(&local_180.exception.ptr.field_1.value);
    }
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }